

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O3

char * __thiscall cmsys::CommandLineArguments::GetHelp(CommandLineArguments *this,char *arg)

{
  iterator iVar1;
  _Base_ptr p_Var2;
  Internal *pIVar3;
  _Base_ptr p_Var4;
  allocator local_51;
  long *local_50 [2];
  long local_40 [2];
  
  pIVar3 = this->Internals;
  std::__cxx11::string::string((string *)local_50,arg,&local_51);
  iVar1 = std::
          _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
          ::find((_Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                  *)&pIVar3->Callbacks,(key_type *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pIVar3 = this->Internals;
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(pIVar3->Callbacks).
       super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
       ._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = (_Base_ptr)0x0;
  }
  else {
    do {
      p_Var4 = iVar1._M_node;
      std::__cxx11::string::string((string *)local_50,(char *)p_Var4[3]._M_left,&local_51);
      iVar1 = std::
              _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
              ::find((_Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                      *)&pIVar3->Callbacks,(key_type *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      pIVar3 = this->Internals;
    } while ((_Rb_tree_header *)iVar1._M_node !=
             &(pIVar3->Callbacks).
              super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
              ._M_t._M_impl.super__Rb_tree_header);
    p_Var2 = p_Var4[3]._M_left;
  }
  return (char *)p_Var2;
}

Assistant:

const char* CommandLineArguments::GetHelp(const char* arg)
{
  CommandLineArguments::Internal::CallbacksMap::iterator it 
    = this->Internals->Callbacks.find(arg);
  if ( it == this->Internals->Callbacks.end() )
    {
    return 0;
    }

  // Since several arguments may point to the same argument, find the one this
  // one point to if this one is pointing to another argument.
  CommandLineArgumentsCallbackStructure *cs = &(it->second);
  for(;;)
    {
    CommandLineArguments::Internal::CallbacksMap::iterator hit 
      = this->Internals->Callbacks.find(cs->Help);
    if ( hit == this->Internals->Callbacks.end() )
      {
      break;
      }
    cs = &(hit->second);
    }
  return cs->Help;
}